

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LowerTriangularLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_lowertriangular
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  LowerTriangularLayerParams *pLVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_lowertriangular(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_lowertriangular(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pLVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::LowerTriangularLayerParams>(arena);
    (this->layer_).lowertriangular_ = pLVar2;
  }
  return (LowerTriangularLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LowerTriangularLayerParams* NeuralNetworkLayer::_internal_mutable_lowertriangular() {
  if (!_internal_has_lowertriangular()) {
    clear_layer();
    set_has_lowertriangular();
    layer_.lowertriangular_ = CreateMaybeMessage< ::CoreML::Specification::LowerTriangularLayerParams >(GetArenaForAllocation());
  }
  return layer_.lowertriangular_;
}